

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *cp,OPJ_UINT32 pino,OPJ_UINT32 tileno)

{
  OPJ_PROG_ORDER *pOVar1;
  byte bVar2;
  opj_tcp_t *poVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 *pOVar5;
  long lVar6;
  OPJ_UINT32 *pOVar7;
  
  if (cp->th * cp->tw <= tileno) {
    __assert_fail("tileno < (cp->tw * cp->th)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x6c4,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  poVar3 = cp->tcps;
  if (poVar3[tileno].numpocs + 1 <= pino) {
    __assert_fail("pino < (cp->tcps[tileno].numpocs + 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x6c5,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  if (poVar3 == (opj_tcp_t *)0x0) {
    __assert_fail("tcp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x6c9,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  pOVar5 = MCT_ELEMENT_SIZE + 2;
  do {
    pOVar1 = (OPJ_PROG_ORDER *)(pOVar5 + 2);
    pOVar5 = pOVar5 + 3;
    if (*pOVar1 == OPJ_PROG_UNKNOWN) break;
  } while (*pOVar1 != poVar3[tileno].prg);
  if ((char)*pOVar5 == '\0') {
    __assert_fail("strlen(prog) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x6d0,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  OVar4 = 1;
  if ((*(byte *)((long)&cp->m_specific_param + 0x11) & 8) != 0) {
    OVar4 = 1;
    lVar6 = 0;
    do {
      bVar2 = *(byte *)((long)pOVar5 + lVar6);
      if (bVar2 < 0x50) {
        pOVar7 = &poVar3[tileno].pocs[pino].compE;
        if ((bVar2 == 0x43) || (pOVar7 = &poVar3[tileno].pocs[pino].layE, bVar2 == 0x4c)) {
LAB_00119b59:
          OVar4 = OVar4 * *pOVar7;
        }
      }
      else {
        pOVar7 = &poVar3[tileno].pocs[pino].prcE;
        if ((bVar2 == 0x50) || (pOVar7 = &poVar3[tileno].pocs[pino].resE, bVar2 == 0x52))
        goto LAB_00119b59;
      }
      if ((uint)(cp->m_specific_param).m_enc.m_tp_flag == (int)(char)bVar2) {
        (cp->m_specific_param).m_dec.m_layer = (OPJ_UINT32)lVar6;
        return OVar4;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
  }
  return OVar4;
}

Assistant:

static OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *cp, OPJ_UINT32 pino,
                                     OPJ_UINT32 tileno)
{
    const OPJ_CHAR *prog = 00;
    OPJ_INT32 i;
    OPJ_UINT32 tpnum = 1;
    opj_tcp_t *tcp = 00;
    opj_poc_t * l_current_poc = 00;

    /*  preconditions */
    assert(tileno < (cp->tw * cp->th));
    assert(pino < (cp->tcps[tileno].numpocs + 1));

    /* get the given tile coding parameter */
    tcp = &cp->tcps[tileno];
    assert(tcp != 00);

    l_current_poc = &(tcp->pocs[pino]);
    assert(l_current_poc != 0);

    /* get the progression order as a character string */
    prog = opj_j2k_convert_progression_order(tcp->prg);
    assert(strlen(prog) > 0);

    if (cp->m_specific_param.m_enc.m_tp_on == 1) {
        for (i = 0; i < 4; ++i) {
            switch (prog[i]) {
            /* component wise */
            case 'C':
                tpnum *= l_current_poc->compE;
                break;
            /* resolution wise */
            case 'R':
                tpnum *= l_current_poc->resE;
                break;
            /* precinct wise */
            case 'P':
                tpnum *= l_current_poc->prcE;
                break;
            /* layer wise */
            case 'L':
                tpnum *= l_current_poc->layE;
                break;
            }
            /* whould we split here ? */
            if (cp->m_specific_param.m_enc.m_tp_flag == prog[i]) {
                cp->m_specific_param.m_enc.m_tp_pos = i;
                break;
            }
        }
    } else {
        tpnum = 1;
    }

    return tpnum;
}